

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void integer_suite::test_int32_one(void)

{
  int value;
  value_type input [5];
  iarchive in;
  int local_b8 [2];
  uchar local_b0 [8];
  iarchive local_a8;
  
  local_b0[4] = '\0';
  local_b0[0] = 0xc4;
  local_b0[1] = '\x01';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>(&local_a8,(uchar (*) [5])local_b0)
  ;
  local_b8[0] = 99;
  trial::protocol::bintoken::iarchive::load<int>(&local_a8,local_b8);
  local_b8[1] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x8c,"void integer_suite::test_int32_one()",local_b8,local_b8 + 1);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void test_int32_one()
{
    const value_type input[] = { token::code::int32, 0x01, 0x00, 0x00, 0x00 };
    format::iarchive in(input);
    int value = 99;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, 1);
}